

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_persist.cpp
# Opt level: O3

bool node::DumpMempool(CTxMemPool *pool,path *dump_path,FopenFn mockable_fopen_function,
                      bool skip_file_commit)

{
  mapped_type_conflict1 mVar1;
  string_view source_file;
  path src;
  path dest;
  undefined8 __stream;
  pointer pTVar2;
  bool bVar3;
  value_type *__val;
  ulong uVar4;
  mapped_type_conflict1 *pmVar5;
  _Base_ptr p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  pointer __dest;
  Logger *pLVar8;
  runtime_error *this;
  ulong in_RCX;
  undefined7 in_register_00000011;
  long lVar9;
  undefined4 uVar10;
  _Rb_tree_header *p_Var11;
  int __fd;
  char *pcVar12;
  TxMempoolInfo *i;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  size_t __n;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file_00;
  string_view source_file_01;
  Span<std::byte> output;
  string_view str;
  string_view logging_function_01;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_long>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_long>_>_>
  pVar14;
  uint64_t mempool_transactions_to_write;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock8;
  string log_msg;
  map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> mapDeltas
  ;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  undefined1 *puVar15;
  char *in_stack_fffffffffffffcd0;
  unsigned_long *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var16;
  undefined4 in_stack_fffffffffffffcf0;
  path *ppVar17;
  ulong uVar18;
  double in_stack_fffffffffffffd08;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffffd10;
  double local_2e8;
  pointer local_2e0;
  vector<std::byte,_std::allocator<std::byte>_> local_2d8;
  vector<std::byte,_std::allocator<std::byte>_> local_2b8;
  undefined1 local_298 [16];
  pointer pbStack_288;
  pointer local_280;
  vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> local_278;
  unique_lock<std::mutex> local_250;
  path local_240;
  path local_218;
  path local_1f0;
  undefined1 local_1c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Stack_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  path local_140;
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_118;
  _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
  local_e8 [2];
  unique_lock<std::recursive_mutex> local_78 [2];
  string local_58;
  long local_38;
  
  lVar9 = CONCAT71(in_register_00000011,skip_file_commit);
  p_Var11 = (_Rb_tree_header *)(in_RCX & 0xffffffff);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = std::chrono::_V2::steady_clock::now();
  local_e8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8[0]._M_impl.super__Rb_tree_header._M_header;
  local_e8[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_278.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_118._M_impl.super__Rb_tree_header;
  local_118._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)p_Var7;
  local_118._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)p_Var7;
  local_e8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
  if (DumpMempool(CTxMemPool_const&,fs::path_const&,std::function<_IO_FILE*(fs::path_const&,char_const*)>,bool)
      ::dump_mutex == '\0') goto LAB_002664ed;
  while( true ) {
    local_250._M_device = &DumpMempool::dump_mutex.super_mutex;
    local_250._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_250);
    uVar10 = SUB84(p_Var11,0);
    local_78[0]._M_device = &(pool->cs).super_recursive_mutex;
    local_78[0]._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(local_78);
    p_Var6 = (pool->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var11 = &(pool->mapDeltas)._M_t._M_impl.super__Rb_tree_header;
    uVar18 = uVar4;
    if ((_Rb_tree_header *)p_Var6 != p_Var11) {
      do {
        mVar1 = *(mapped_type_conflict1 *)(p_Var6 + 2);
        pmVar5 = std::
                 map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
                 ::operator[]((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
                               *)local_e8,(key_type *)(p_Var6 + 1));
        *pmVar5 = mVar1;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var11);
    }
    CTxMemPool::infoAll((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)&local_58,pool);
    local_1b8._M_allocated_capacity =
         (size_type)
         local_278.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    paStack_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
    local_1c8 = (undefined1  [8])
                local_278.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_278.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_58.field_2._M_allocated_capacity;
    local_278.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_58._M_dataplus._M_p;
    local_278.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_58._M_string_length;
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::~vector
              ((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)local_1c8);
    std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::~vector
              ((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)&local_58);
    CTxMemPool::GetUnbroadcastTxs
              ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)local_1c8,pool);
    std::
    _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
    ::clear(&local_118);
    if ((pointer)local_1b8._M_allocated_capacity != (pointer)0x0) {
      local_118._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)paStack_1c0;
      local_118._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_1b8._M_allocated_capacity;
      local_118._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1b8._8_8_;
      local_118._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)_Stack_1a8._M_head_impl;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8._M_allocated_capacity + 8))->_M_pi =
           p_Var7;
      local_118._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_1a0;
      local_1b8._M_allocated_capacity = 0;
      local_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      local_1b8._8_8_ = (_Base_ptr)&paStack_1c0;
      _Stack_1a8._M_head_impl = (_Impl *)&paStack_1c0;
    }
    std::
    _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
    ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                 *)local_1c8);
    std::unique_lock<std::recursive_mutex>::~unique_lock(local_78);
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::chrono::_V2::steady_clock::now();
    std::filesystem::__cxx11::path::path(&local_140,&dump_path->super_path);
    std::filesystem::__cxx11::path::_M_concat(&local_140,4,".new");
    std::filesystem::__cxx11::path::path((path *)local_1c8,&local_140);
    local_58._M_dataplus._M_p = "wb";
    if (*(long *)(lVar9 + 0x10) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_function_call();
        goto LAB_00266513;
      }
      goto LAB_00266a86;
    }
    local_298._0_8_ = (**(code **)(lVar9 + 0x18))(lVar9,local_1c8,&local_58);
    local_298._8_8_ = (pointer)0x0;
    pbStack_288 = (pointer)0x0;
    local_280 = (pointer)0x0;
    std::filesystem::__cxx11::path::~path((path *)local_1c8);
    std::filesystem::__cxx11::path::~path(&local_140);
    if ((FILE *)local_298._0_8_ == (FILE *)0x0) {
      bVar3 = false;
      goto LAB_00266a1e;
    }
    local_1c8 = (undefined1  [8])(2 - (ulong)(pool->m_opts).persist_v1_dat);
    AutoFile::write((AutoFile *)local_298,(int)local_1c8,&DAT_00000008,(size_t)local_1c8);
    local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(8);
    local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start + 8;
    local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start[0] = 0;
    local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start[1] = 0;
    local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start[2] = 0;
    local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start[3] = 0;
    local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start[4] = 0;
    local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start[5] = 0;
    local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start[6] = 0;
    local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start[7] = 0;
    local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((pool->m_opts).persist_v1_dat == true) break;
    FastRandomContext::FastRandomContext((FastRandomContext *)local_1c8,false);
    output.m_size =
         (long)local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    output.m_data =
         local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    FastRandomContext::fillrand((FastRandomContext *)local_1c8,output);
    ChaCha20::~ChaCha20((ChaCha20 *)&local_1b8);
    AutoFile::operator<<((AutoFile *)local_298,&local_2b8);
    local_2d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar4 = (long)local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      local_2d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      __n = 0;
      __dest = (pointer)0x0;
      local_2d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_002660b4;
    }
    if (-1 < (long)uVar4) goto LAB_00266064;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00266a86;
    std::__throw_bad_alloc();
LAB_002664ed:
    DumpMempool();
  }
  uVar4 = 8;
LAB_00266064:
  local_2d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  __dest = (pointer)operator_new(uVar4);
  local_2d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __dest + uVar4;
  __n = (long)local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_2d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = __dest;
  if (__n != 0) {
    local_2d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = __dest;
    memmove(__dest,local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start,__n);
  }
LAB_002660b4:
  local_2d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = __dest + __n;
  std::vector<std::byte,_std::allocator<std::byte>_>::operator=
            ((vector<std::byte,_std::allocator<std::byte>_> *)(local_298 + 8),&local_2d8);
  if (local_2d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_2e0 = (pointer)(((long)local_278.
                               super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_278.
                               super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555)
  ;
  local_1c8 = (undefined1  [8])local_2e0;
  AutoFile::write((AutoFile *)local_298,(int)local_1c8,&DAT_00000008,(size_t)local_2e0);
  logging_function._M_str = "DumpMempool";
  logging_function._M_len = 0xb;
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
  ;
  source_file_00._M_len = 0x61;
  pcVar12 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
  ;
  LogPrintf_<unsigned_long>
            (logging_function,source_file_00,0xbd,
             IPC|MEMPOOLREJ|PROXY|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|ADDRMAN|ESTIMATEFEE|WALLETDB|
             BENCH|MEMPOOL|TOR|NET,(Level)&local_2e0,in_stack_fffffffffffffcd0,
             in_stack_fffffffffffffcd8);
  pTVar2 = local_278.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_278.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_278.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl
                 .super__Vector_impl_data._M_start;
    do {
      local_1c8 = (undefined1  [8])&::TX_WITH_WITNESS;
      paStack_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298;
      SerializeTransaction<ParamsStream<AutoFile&,TransactionSerParams>,CTransaction>
                ((CTransaction *)paVar13->_M_allocated_capacity,
                 (ParamsStream<AutoFile_&,_TransactionSerParams> *)local_1c8,&::TX_WITH_WITNESS);
      local_1c8 = *(undefined1 (*) [8])(paVar13->_M_local_buf + 0x10);
      __fd = (int)(ParamsStream<AutoFile_&,_TransactionSerParams> *)local_1c8;
      AutoFile::write((AutoFile *)local_298,__fd,&DAT_00000008,(size_t)pcVar12);
      local_1c8 = (undefined1  [8])
                  (((vector<std::byte,_std::allocator<std::byte>_> *)(paVar13->_M_local_buf + 0x28))
                  ->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      AutoFile::write((AutoFile *)local_298,__fd,&DAT_00000008,(size_t)pcVar12);
      pVar14 = std::
               _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
               ::equal_range(local_e8,(key_type *)(paVar13->_M_allocated_capacity + 0x39));
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
      ::_M_erase_aux(local_e8,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
      paVar13 = paVar13 + 3;
    } while (paVar13 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pTVar2);
  }
  Serialize<AutoFile,uint256,long,std::less<uint256>,std::allocator<std::pair<uint256_const,long>>>
            ((AutoFile *)local_298,
             (map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
              *)local_e8);
  local_1c8 = (undefined1  [8])local_118._M_impl.super__Rb_tree_header._M_node_count;
  puVar15 = local_1c8;
  pcVar12 = "Writing %d unbroadcast transactions to file.\n";
  logging_function_00._M_str = "DumpMempool";
  logging_function_00._M_len = 0xb;
  source_file_01._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
  ;
  source_file_01._M_len = 0x61;
  _Var16._M_head_impl = (_Impl *)p_Var7;
  ppVar17 = &dump_path->super_path;
  LogPrintf_<unsigned_long>
            (logging_function_00,source_file_01,199,
             IPC|MEMPOOLREJ|PROXY|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|ADDRMAN|ESTIMATEFEE|RPC|TOR|
             NET,(Level)puVar15,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcd8);
  Serialize<AutoFile,uint256,std::less<uint256>,std::allocator<uint256>>
            ((AutoFile *)local_298,
             (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)&local_118);
  if ((char)uVar10 == '\0') {
    bVar3 = FileCommit((FILE *)local_298._0_8_);
    if (bVar3) goto LAB_002662a9;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"FileCommit failed");
  }
  else {
LAB_002662a9:
    __stream = local_298._0_8_;
    local_298._0_8_ = (FILE *)0x0;
    if ((FILE *)__stream != (FILE *)0x0) {
      fclose((FILE *)__stream);
    }
    std::filesystem::__cxx11::path::path(&local_218,&dump_path->super_path);
    std::filesystem::__cxx11::path::_M_concat(&local_218,4,".new");
    std::filesystem::__cxx11::path::path(&local_1f0,&local_218);
    std::filesystem::__cxx11::path::path(&local_240,&dump_path->super_path);
    src.super_path._M_pathname._M_string_length = (size_type)in_stack_fffffffffffffcd0;
    src.super_path._M_pathname._M_dataplus._M_p = puVar15;
    src.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffcd8;
    src.super_path._M_pathname.field_2._8_4_ = in_stack_fffffffffffffce0;
    src.super_path._M_pathname.field_2._12_4_ = in_stack_fffffffffffffce4;
    src.super_path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )_Var16._M_head_impl;
    dest.super_path._M_pathname._M_dataplus._M_p._4_4_ = uVar10;
    dest.super_path._M_pathname._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffcf0;
    dest.super_path._M_pathname._M_string_length = (size_type)ppVar17;
    dest.super_path._M_pathname.field_2._M_allocated_capacity = uVar18;
    dest.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffd08;
    dest.super_path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )in_stack_fffffffffffffd10._M_head_impl;
    bVar3 = RenameOver(src,dest);
    std::filesystem::__cxx11::path::~path(&local_240);
    std::filesystem::__cxx11::path::~path(&local_1f0);
    std::filesystem::__cxx11::path::~path(&local_218);
    if (bVar3) {
      std::chrono::_V2::steady_clock::now();
      local_2e8 = (double)(long)((long)p_Var7 - uVar18) / 1000000000.0;
      std::filesystem::file_size((path *)dump_path);
      pLVar8 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar8);
      if (bVar3) {
        paStack_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_1b8._M_allocated_capacity = local_1b8._M_allocated_capacity & 0xffffffffffffff00;
        local_1c8 = (undefined1  [8])&local_1b8;
        tinyformat::format<double,double,unsigned_long>
                  (&local_58,
                   (tinyformat *)
                   "Dumped mempool: %.3fs to copy, %.3fs to dump, %d bytes dumped to file\n",
                   (char *)&local_2e8,(double *)&stack0xfffffffffffffd10,
                   (double *)&stack0xfffffffffffffd08,(unsigned_long *)pcVar12);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                   &local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        pLVar8 = LogInstance();
        local_58._M_dataplus._M_p = (pointer)0x61;
        local_58._M_string_length = 0x81bd6c;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
        ;
        source_file._M_len = 0x61;
        str._M_str = (char *)local_1c8;
        str._M_len = (size_t)paStack_1c0;
        logging_function_01._M_str = "DumpMempool";
        logging_function_01._M_len = 0xb;
        BCLog::Logger::LogPrintStr(pLVar8,str,logging_function_01,source_file,0xd5,ALL,Info);
        if (local_1c8 != (undefined1  [8])&local_1b8) {
          operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
        }
      }
      if (local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      bVar3 = true;
LAB_00266a1e:
      AutoFile::~AutoFile((AutoFile *)local_298);
      std::unique_lock<std::mutex>::~unique_lock(&local_250);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&local_118);
      std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::~vector(&local_278);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
      ::~_Rb_tree(local_e8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return bVar3;
      }
      goto LAB_00266a86;
    }
LAB_00266513:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Rename failed");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00266a86:
  __stack_chk_fail();
}

Assistant:

bool DumpMempool(const CTxMemPool& pool, const fs::path& dump_path, FopenFn mockable_fopen_function, bool skip_file_commit)
{
    auto start = SteadyClock::now();

    std::map<uint256, CAmount> mapDeltas;
    std::vector<TxMempoolInfo> vinfo;
    std::set<uint256> unbroadcast_txids;

    static Mutex dump_mutex;
    LOCK(dump_mutex);

    {
        LOCK(pool.cs);
        for (const auto &i : pool.mapDeltas) {
            mapDeltas[i.first] = i.second;
        }
        vinfo = pool.infoAll();
        unbroadcast_txids = pool.GetUnbroadcastTxs();
    }

    auto mid = SteadyClock::now();

    AutoFile file{mockable_fopen_function(dump_path + ".new", "wb")};
    if (file.IsNull()) {
        return false;
    }

    try {
        const uint64_t version{pool.m_opts.persist_v1_dat ? MEMPOOL_DUMP_VERSION_NO_XOR_KEY : MEMPOOL_DUMP_VERSION};
        file << version;

        std::vector<std::byte> xor_key(8);
        if (!pool.m_opts.persist_v1_dat) {
            FastRandomContext{}.fillrand(xor_key);
            file << xor_key;
        }
        file.SetXor(xor_key);

        uint64_t mempool_transactions_to_write(vinfo.size());
        file << mempool_transactions_to_write;
        LogInfo("Writing %u mempool transactions to file...\n", mempool_transactions_to_write);
        for (const auto& i : vinfo) {
            file << TX_WITH_WITNESS(*(i.tx));
            file << int64_t{count_seconds(i.m_time)};
            file << int64_t{i.nFeeDelta};
            mapDeltas.erase(i.tx->GetHash());
        }

        file << mapDeltas;

        LogInfo("Writing %d unbroadcast transactions to file.\n", unbroadcast_txids.size());
        file << unbroadcast_txids;

        if (!skip_file_commit && !FileCommit(file.Get()))
            throw std::runtime_error("FileCommit failed");
        file.fclose();
        if (!RenameOver(dump_path + ".new", dump_path)) {
            throw std::runtime_error("Rename failed");
        }
        auto last = SteadyClock::now();

        LogInfo("Dumped mempool: %.3fs to copy, %.3fs to dump, %d bytes dumped to file\n",
                  Ticks<SecondsDouble>(mid - start),
                  Ticks<SecondsDouble>(last - mid),
                  fs::file_size(dump_path));
    } catch (const std::exception& e) {
        LogInfo("Failed to dump mempool: %s. Continuing anyway.\n", e.what());
        return false;
    }
    return true;
}